

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::Compiler::Node_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::Compiler::Node_*>::operator=
          (ArrayBuilder<capnp::compiler::Compiler::Node_*> *this,
          ArrayBuilder<capnp::compiler::Compiler::Node_*> *other)

{
  Node **ppNVar1;
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar2;
  Node **ppNVar3;
  ArrayDisposer *pAVar4;
  
  ppNVar1 = this->ptr;
  if (ppNVar1 != (Node **)0x0) {
    ppNVar2 = this->pos;
    ppNVar3 = this->endPtr;
    this->ptr = (Node **)0x0;
    this->pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
    this->endPtr = (Node **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppNVar1,8,(long)ppNVar2 - (long)ppNVar1 >> 3,
               (long)ppNVar3 - (long)ppNVar1 >> 3,0);
  }
  ppNVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppNVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Node **)0x0;
  other->pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  other->endPtr = (Node **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }